

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O0

Error asmjit::X86Logging_formatImmExtended
                (StringBuilder *sb,uint32_t logOptions,uint32_t instId,uint32_t vecSize,Imm *imm)

{
  uint uVar1;
  Error EVar2;
  uint *puVar3;
  uint in_ECX;
  int in_EDX;
  uint32_t in_ESI;
  StringBuilder *in_RDI;
  long in_R8;
  uint32_t bits;
  uint32_t count;
  uint32_t u8;
  undefined8 in_stack_ffffffffffffff68;
  uint32_t count_00;
  uint32_t bits_00;
  undefined8 in_stack_ffffffffffffff70;
  uint32_t count_01;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  uint32_t advance;
  uint32_t bits_01;
  undefined8 in_stack_ffffffffffffff88;
  uint32_t u8_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48 [3];
  uint local_3c;
  uint local_38;
  uint local_34;
  uint32_t count_02;
  undefined4 in_stack_ffffffffffffffd8;
  Error local_c;
  
  advance = (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  uVar1 = (uint)*(byte *)(in_R8 + 8);
  count_01 = (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  count_00 = (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  bits_00 = (uint32_t)in_stack_ffffffffffffff70;
  local_34 = uVar1;
  if (in_EDX == 0x22) {
LAB_00213f93:
    local_c = X86Logging_formatImmShuf
                        ((StringBuilder *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),count_01,
                         bits_00,count_00);
  }
  else {
    if (in_EDX == 0x23) {
LAB_00213fbf:
      EVar2 = X86Logging_formatImmShuf
                        ((StringBuilder *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),count_01,
                         bits_00,count_00);
      return EVar2;
    }
    bits_01 = (uint32_t)in_stack_ffffffffffffff88;
    u8_00 = (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    if ((in_EDX - 0x68U < 2) || (in_EDX - 0x6bU < 2)) {
      EVar2 = X86Logging_formatImmText
                        ((StringBuilder *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),u8_00,bits_01
                         ,advance,(char *)CONCAT44(in_stack_ffffffffffffff7c,
                                                   in_stack_ffffffffffffff78),count_01);
      return EVar2;
    }
    if (in_EDX - 0x95U < 2) {
LAB_00214074:
      EVar2 = X86Logging_formatImmShuf
                        ((StringBuilder *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),count_01,
                         bits_00,count_00);
      return EVar2;
    }
    if (in_EDX == 0x1ae) {
LAB_0021409b:
      local_38 = in_ECX >> 3;
      local_3c = 4;
      std::min<unsigned_int>(&local_38,&local_3c);
      EVar2 = X86Logging_formatImmBits
                        (in_RDI,in_ESI,(ImmBits *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                         (uint32_t)((ulong)in_R8 >> 0x20));
      return EVar2;
    }
    if (in_EDX == 0x1d5) {
LAB_00214104:
      EVar2 = X86Logging_formatImmShuf
                        ((StringBuilder *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),count_01,
                         bits_00,count_00);
      return EVar2;
    }
    count_02 = (uint32_t)((ulong)in_R8 >> 0x20);
    if (in_EDX == 0x1d6) {
LAB_00214192:
      EVar2 = X86Logging_formatImmBits
                        (in_RDI,in_ESI,(ImmBits *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                         count_02);
      return EVar2;
    }
    if (in_EDX == 0x240) {
LAB_0021432d:
      EVar2 = X86Logging_formatImmShuf
                        ((StringBuilder *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),count_01,
                         bits_00,count_00);
      return EVar2;
    }
    if (in_EDX - 0x241U < 3) {
LAB_00214354:
      EVar2 = X86Logging_formatImmShuf
                        ((StringBuilder *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),count_01,
                         bits_00,count_00);
      return EVar2;
    }
    if (in_EDX - 0x27aU < 4) {
LAB_002141bb:
      EVar2 = X86Logging_formatImmBits
                        (in_RDI,in_ESI,(ImmBits *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                         count_02);
      return EVar2;
    }
    if (in_EDX == 0x2b4) {
LAB_002141e4:
      local_48[0] = in_ECX >> 3;
      local_4c = 8;
      std::min<unsigned_int>(local_48,&local_4c);
      EVar2 = X86Logging_formatImmText
                        ((StringBuilder *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff88,advance,
                         (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      return EVar2;
    }
    if (in_EDX != 0x2b5) {
      if (in_EDX == 0x2f5) goto LAB_00213f93;
      if (in_EDX == 0x2f6) goto LAB_00213fbf;
      if (in_EDX - 0x307U < 4) {
        EVar2 = X86Logging_formatImmText
                          ((StringBuilder *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),u8_00,
                           bits_01,advance,
                           (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           count_01);
        return EVar2;
      }
      if (in_EDX == 0x319) {
        EVar2 = X86Logging_formatImmBits
                          (in_RDI,in_ESI,(ImmBits *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                           count_02);
        return EVar2;
      }
      if (in_EDX == 0x339) {
        EVar2 = X86Logging_formatImmShuf
                          ((StringBuilder *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),count_01,
                           bits_00,count_00);
        return EVar2;
      }
      if (in_EDX - 0x33eU < 2) goto LAB_00214074;
      if (in_EDX - 0x351U < 4) {
        return 0;
      }
      if (in_EDX - 0x3a5U < 4) {
        EVar2 = X86Logging_formatImmBits
                          (in_RDI,in_ESI,(ImmBits *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                           count_02);
        return EVar2;
      }
      if (in_EDX - 0x3bdU < 4) {
        EVar2 = X86Logging_formatImmBits
                          (in_RDI,in_ESI,(ImmBits *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                           count_02);
        return EVar2;
      }
      if (in_EDX == 0x3fc) goto LAB_0021409b;
      if (in_EDX == 0x41e) {
        local_48[2] = in_ECX >> 2;
        local_48[1] = 8;
        std::min<unsigned_int>(local_48 + 2,local_48 + 1);
        EVar2 = X86Logging_formatImmShuf
                          ((StringBuilder *)CONCAT44(uVar1,in_stack_ffffffffffffff78),
                           (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,count_00);
        return EVar2;
      }
      if (in_EDX == 0x420) goto LAB_00214104;
      if (in_EDX == 0x427) goto LAB_00214192;
      if ((in_EDX - 0x429U < 2) || (in_EDX - 0x437U < 6)) {
        EVar2 = X86Logging_formatImmText
                          ((StringBuilder *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),u8_00,
                           bits_01,advance,
                           (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           count_01);
        return EVar2;
      }
      if ((in_EDX - 0x43dU < 2) || (in_EDX - 0x441U < 6)) {
        EVar2 = X86Logging_formatImmText
                          ((StringBuilder *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),u8_00,
                           bits_01,advance,
                           (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           count_01);
        return EVar2;
      }
      if (in_EDX - 0x449U < 2) {
        EVar2 = X86Logging_formatImmBits
                          (in_RDI,in_ESI,(ImmBits *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                           count_02);
        return EVar2;
      }
      if (in_EDX == 0x455) {
        EVar2 = X86Logging_formatImmShuf
                          ((StringBuilder *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),count_01,
                           bits_00,count_00);
        return EVar2;
      }
      if (in_EDX == 0x456) {
        EVar2 = X86Logging_formatImmShuf
                          ((StringBuilder *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),count_01,
                           bits_00,count_00);
        return EVar2;
      }
      if ((in_EDX == 0x457) || (in_EDX == 0x459)) {
        EVar2 = X86Logging_formatImmShuf
                          ((StringBuilder *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),count_01,
                           bits_00,count_00);
        return EVar2;
      }
      if (in_EDX == 0x4f9) goto LAB_0021432d;
      if (in_EDX - 0x4faU < 2) goto LAB_00214354;
      if (in_EDX - 0x51bU < 2) {
        EVar2 = X86Logging_formatImmShuf
                          ((StringBuilder *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),count_01,
                           bits_00,count_00);
        return EVar2;
      }
      if (in_EDX - 0x531U < 4) {
        EVar2 = X86Logging_formatImmBits
                          (in_RDI,in_ESI,(ImmBits *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                           count_02);
        return EVar2;
      }
      if (in_EDX - 0x53fU < 8) {
        EVar2 = X86Logging_formatImmBits
                          (in_RDI,in_ESI,(ImmBits *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                           count_02);
        return EVar2;
      }
      if (in_EDX - 0x547U < 4) goto LAB_002141bb;
      if (in_EDX - 0x565U < 4) {
        local_54 = in_ECX >> 4;
        local_58 = 2;
        puVar3 = std::max<unsigned_int>(&local_54,&local_58);
        local_50 = *puVar3;
        EVar2 = X86Logging_formatImmShuf
                          ((StringBuilder *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           (uint32_t)in_stack_ffffffffffffff70,count_00);
        return EVar2;
      }
      if (in_EDX == 0x569) goto LAB_002141e4;
      if (in_EDX != 0x56a) {
        return 0;
      }
    }
    local_c = X86Logging_formatImmText
                        ((StringBuilder *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),u8_00,bits_01
                         ,advance,(char *)CONCAT44(in_stack_ffffffffffffff7c,
                                                   in_stack_ffffffffffffff78),count_01);
  }
  return local_c;
}

Assistant:

ASMJIT_FAVOR_SIZE static Error X86Logging_formatImmExtended(
  StringBuilder& sb,
  uint32_t logOptions,
  uint32_t instId,
  uint32_t vecSize,
  const Imm& imm) noexcept {

  static const char vcmpx[] =
    "eq_oq\0" "lt_os\0"  "le_os\0"  "unord_q\0"  "neq_uq\0" "nlt_us\0" "nle_us\0" "ord_q\0"
    "eq_uq\0" "nge_us\0" "ngt_us\0" "false_oq\0" "neq_oq\0" "ge_os\0"  "gt_os\0"  "true_uq\0"
    "eq_os\0" "lt_oq\0"  "le_oq\0"  "unord_s\0"  "neq_us\0" "nlt_uq\0" "nle_uq\0" "ord_s\0"
    "eq_us\0" "nge_uq\0" "ngt_uq\0" "false_os\0" "neq_os\0" "ge_oq\0"  "gt_oq\0"  "true_us\0";

  // Try to find 7 differences...
  static const char vpcmpx[] = "eq\0" "lt\0" "le\0" "false\0" "neq\0" "ge\0"  "gt\0"    "true\0";
  static const char vpcomx[] = "lt\0" "le\0" "gt\0" "ge\0"    "eq\0"  "neq\0" "false\0" "true\0";

  static const char vshufpd[] = "a0\0a1\0b0\0b1\0a2\0a3\0b2\0b3\0a4\0a5\0b4\0b5\0a6\0a7\0b6\0b7\0";
  static const char vshufps[] = "a0\0a1\0a2\0a3\0a0\0a1\0a2\0a3\0b0\0b1\0b2\0b3\0b0\0b1\0b2\0b3\0";

  static const ImmBits vfpclassxx[] = {
    { 0x07, 0, ImmBits::kModeLookup, "qnan\0" "+0\0" "-0\0" "+inf\0" "-inf\0" "denormal\0" "-finite\0" "snan\0" }
  };

  static const ImmBits vgetmantxx[] = {
    { 0x03, 0, ImmBits::kModeLookup, "[1, 2)\0" "[1/2, 2)\0" "1/2, 1)\0" "[3/4, 3/2)\0" },
    { 0x04, 2, ImmBits::kModeLookup, "\0" "no-sign\0" },
    { 0x08, 3, ImmBits::kModeLookup, "\0" "qnan-if-sign\0" }
  };

  static const ImmBits vmpsadbw[] = {
    { 0x04, 2, ImmBits::kModeLookup, "blk1[0]\0" "blk1[1]\0" },
    { 0x03, 0, ImmBits::kModeLookup, "blk2[0]\0" "blk2[1]\0" "blk2[2]\0" "blk2[3]\0" },
    { 0x40, 6, ImmBits::kModeLookup, "blk1[4]\0" "blk1[5]\0" },
    { 0x30, 4, ImmBits::kModeLookup, "blk2[4]\0" "blk2[5]\0" "blk2[6]\0" "blk2[7]\0" }
  };

  static const ImmBits vpclmulqdq[] = {
    { 0x01, 0, ImmBits::kModeLookup, "lq\0" "hq\0" },
    { 0x10, 4, ImmBits::kModeLookup, "lq\0" "hq\0" }
  };

  static const ImmBits vperm2x128[] = {
    { 0x0B, 0, ImmBits::kModeLookup, "a0\0" "a1\0" "b0\0" "b1\0" "\0" "\0" "\0" "\0" "0\0" "0\0" "0\0" "0\0" },
    { 0xB0, 4, ImmBits::kModeLookup, "a0\0" "a1\0" "b0\0" "b1\0" "\0" "\0" "\0" "\0" "0\0" "0\0" "0\0" "0\0" }
  };

  static const ImmBits vrangexx[] = {
    { 0x03, 0, ImmBits::kModeLookup, "min\0" "max\0" "min-abs\0" "max-abs\0" },
    { 0x0C, 2, ImmBits::kModeLookup, "sign=src1\0" "sign=src2\0" "sign=0\0" "sign=1\0" }
  };

  static const ImmBits vreducexx_vrndscalexx[] = {
    { 0x07, 0, ImmBits::kModeLookup, "\0" "\0" "\0" "\0" "round\0" "floor\0" "ceil\0" "truncate\0" },
    { 0x08, 3, ImmBits::kModeLookup, "\0" "suppress\0" },
    { 0xF0, 4, ImmBits::kModeFormat, "len=%d" }
  };

  static const ImmBits vroundxx[] = {
    { 0x07, 0, ImmBits::kModeLookup, "round\0" "floor\0" "ceil\0" "truncate\0" "\0" "\0" "\0" "\0" },
    { 0x08, 3, ImmBits::kModeLookup, "\0" "inexact\0" }
  };

  uint32_t u8 = imm.getUInt8();
  switch (instId) {
    case X86Inst::kIdVblendpd:
    case X86Inst::kIdBlendpd:
      return X86Logging_formatImmShuf(sb, u8, 1, vecSize / 8);

    case X86Inst::kIdVblendps:
    case X86Inst::kIdBlendps:
      return X86Logging_formatImmShuf(sb, u8, 1, vecSize / 4);

    case X86Inst::kIdVcmppd:
    case X86Inst::kIdVcmpps:
    case X86Inst::kIdVcmpsd:
    case X86Inst::kIdVcmpss:
      return X86Logging_formatImmText(sb, u8, 5, 0, vcmpx);

    case X86Inst::kIdCmppd:
    case X86Inst::kIdCmpps:
    case X86Inst::kIdCmpsd:
    case X86Inst::kIdCmpss:
      return X86Logging_formatImmText(sb, u8, 3, 0, vcmpx);

    case X86Inst::kIdVdbpsadbw:
      return X86Logging_formatImmShuf(sb, u8, 2, 4);

    case X86Inst::kIdVdppd:
    case X86Inst::kIdVdpps:
    case X86Inst::kIdDppd:
    case X86Inst::kIdDpps:
      return X86Logging_formatImmShuf(sb, u8, 1, 8);

    case X86Inst::kIdVmpsadbw:
    case X86Inst::kIdMpsadbw:
      return X86Logging_formatImmBits(sb, u8, vmpsadbw, std::min<uint32_t>(vecSize / 8, 4));

    case X86Inst::kIdVpblendw:
    case X86Inst::kIdPblendw:
      return X86Logging_formatImmShuf(sb, u8, 1, 8);

    case X86Inst::kIdVpblendd:
      return X86Logging_formatImmShuf(sb, u8, 1, std::min<uint32_t>(vecSize / 4, 8));

    case X86Inst::kIdVpclmulqdq:
    case X86Inst::kIdPclmulqdq:
      return X86Logging_formatImmBits(sb, u8, vpclmulqdq, ASMJIT_ARRAY_SIZE(vpclmulqdq));

    case X86Inst::kIdVroundpd:
    case X86Inst::kIdVroundps:
    case X86Inst::kIdVroundsd:
    case X86Inst::kIdVroundss:
    case X86Inst::kIdRoundpd:
    case X86Inst::kIdRoundps:
    case X86Inst::kIdRoundsd:
    case X86Inst::kIdRoundss:
      return X86Logging_formatImmBits(sb, u8, vroundxx, ASMJIT_ARRAY_SIZE(vroundxx));

    case X86Inst::kIdVshufpd:
    case X86Inst::kIdShufpd:
      return X86Logging_formatImmText(sb, u8, 1, 2, vshufpd, std::min<uint32_t>(vecSize / 8, 8));

    case X86Inst::kIdVshufps:
    case X86Inst::kIdShufps:
      return X86Logging_formatImmText(sb, u8, 2, 4, vshufps, 4);

    case X86Inst::kIdVcvtps2ph:
      return X86Logging_formatImmBits(sb, u8, vroundxx, 1);

    case X86Inst::kIdVperm2f128:
    case X86Inst::kIdVperm2i128:
      return X86Logging_formatImmBits(sb, u8, vperm2x128, ASMJIT_ARRAY_SIZE(vperm2x128));

    case X86Inst::kIdVpermilpd:
      return X86Logging_formatImmShuf(sb, u8, 1, vecSize / 8);

    case X86Inst::kIdVpermilps:
      return X86Logging_formatImmShuf(sb, u8, 2, 4);

    case X86Inst::kIdVpshufd:
    case X86Inst::kIdPshufd:
      return X86Logging_formatImmShuf(sb, u8, 2, 4);

    case X86Inst::kIdVpshufhw:
    case X86Inst::kIdVpshuflw:
    case X86Inst::kIdPshufhw:
    case X86Inst::kIdPshuflw:
    case X86Inst::kIdPshufw:
      return X86Logging_formatImmShuf(sb, u8, 2, 4);

    // TODO: Maybe?
    case X86Inst::kIdVfixupimmpd:
    case X86Inst::kIdVfixupimmps:
    case X86Inst::kIdVfixupimmsd:
    case X86Inst::kIdVfixupimmss:
      return kErrorOk;

    case X86Inst::kIdVfpclasspd:
    case X86Inst::kIdVfpclassps:
    case X86Inst::kIdVfpclasssd:
    case X86Inst::kIdVfpclassss:
      return X86Logging_formatImmBits(sb, u8, vfpclassxx, ASMJIT_ARRAY_SIZE(vfpclassxx));

    case X86Inst::kIdVgetmantpd:
    case X86Inst::kIdVgetmantps:
    case X86Inst::kIdVgetmantsd:
    case X86Inst::kIdVgetmantss:
      return X86Logging_formatImmBits(sb, u8, vgetmantxx, ASMJIT_ARRAY_SIZE(vgetmantxx));

    case X86Inst::kIdVpcmpb:
    case X86Inst::kIdVpcmpd:
    case X86Inst::kIdVpcmpq:
    case X86Inst::kIdVpcmpw:
    case X86Inst::kIdVpcmpub:
    case X86Inst::kIdVpcmpud:
    case X86Inst::kIdVpcmpuq:
    case X86Inst::kIdVpcmpuw:
      return X86Logging_formatImmText(sb, u8, 2, 4, vpcmpx, 4);

    case X86Inst::kIdVpcomb:
    case X86Inst::kIdVpcomd:
    case X86Inst::kIdVpcomq:
    case X86Inst::kIdVpcomw:
    case X86Inst::kIdVpcomub:
    case X86Inst::kIdVpcomud:
    case X86Inst::kIdVpcomuq:
    case X86Inst::kIdVpcomuw:
      return X86Logging_formatImmText(sb, u8, 2, 4, vpcomx, 4);

    case X86Inst::kIdVpermq:
    case X86Inst::kIdVpermpd:
      return X86Logging_formatImmShuf(sb, u8, 2, 4);

    case X86Inst::kIdVpternlogd:
    case X86Inst::kIdVpternlogq:
      return X86Logging_formatImmShuf(sb, u8, 1, 8);

    case X86Inst::kIdVrangepd:
    case X86Inst::kIdVrangeps:
    case X86Inst::kIdVrangesd:
    case X86Inst::kIdVrangess:
      return X86Logging_formatImmBits(sb, u8, vrangexx, ASMJIT_ARRAY_SIZE(vrangexx));

    case X86Inst::kIdVreducepd:
    case X86Inst::kIdVreduceps:
    case X86Inst::kIdVreducesd:
    case X86Inst::kIdVreducess:
    case X86Inst::kIdVrndscalepd:
    case X86Inst::kIdVrndscaleps:
    case X86Inst::kIdVrndscalesd:
    case X86Inst::kIdVrndscaless:
      return X86Logging_formatImmBits(sb, u8, vreducexx_vrndscalexx, ASMJIT_ARRAY_SIZE(vreducexx_vrndscalexx));

    case X86Inst::kIdVshuff32x4:
    case X86Inst::kIdVshuff64x2:
    case X86Inst::kIdVshufi32x4:
    case X86Inst::kIdVshufi64x2: {
      uint32_t count = std::max<uint32_t>(vecSize / 16, 2);
      uint32_t bits = count <= 2 ? 1 : 2;
      return X86Logging_formatImmShuf(sb, u8, bits, count);
    }

    default:
      return kErrorOk;
  }
}